

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_uniq(REF_EDGE ref_edge,REF_INT node0,REF_INT node1)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  undefined8 in_RAX;
  REF_INT *pRVar4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  uVar3 = ref_edge_with(ref_edge,node0,node1,&local_34);
  if ((uVar3 == 0) || (uVar3 == 5)) {
    uVar3 = 0;
    if (local_34 == -1) {
      iVar7 = ref_edge->n;
      iVar1 = ref_edge->max;
      lVar8 = (long)iVar1;
      if (iVar7 < iVar1) {
        pRVar4 = ref_edge->e2n;
      }
      else {
        iVar7 = 5000;
        if (5000 < (int)((double)iVar1 * 1.5)) {
          iVar7 = (int)((double)iVar1 * 1.5);
        }
        ref_edge->max = iVar7 + iVar1;
        fflush(_stdout);
        if (ref_edge->max < 1) {
          pRVar4 = ref_edge->e2n;
        }
        else {
          pRVar4 = (REF_INT *)realloc(ref_edge->e2n,(ulong)(uint)ref_edge->max << 3);
          ref_edge->e2n = pRVar4;
        }
        if (pRVar4 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x72,"ref_edge_uniq","realloc ref_edge->e2n NULL");
          uVar2 = (long)ref_edge->max * 2;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar2 & 0xffffffff,uVar2
                 ,4,(long)ref_edge->max << 3);
          return 2;
        }
        if (iVar1 < ref_edge->max) {
          do {
            (pRVar4 + lVar8 * 2)[0] = -1;
            (pRVar4 + lVar8 * 2)[1] = -1;
            lVar8 = lVar8 + 1;
          } while (lVar8 < ref_edge->max);
        }
        iVar7 = ref_edge->n;
      }
      ref_edge->n = iVar7 + 1;
      pRVar4[iVar7 * 2] = node0;
      iVar1 = iVar7 * 2 + 1;
      pRVar4[iVar1] = node1;
      uVar3 = ref_adj_add(ref_edge->adj,node0,iVar7);
      if (uVar3 == 0) {
        uVar3 = ref_adj_add(ref_edge->adj,ref_edge->e2n[iVar1],iVar7);
        if (uVar3 == 0) {
          return 0;
        }
        pcVar6 = "adj n1";
        uVar5 = 0x83;
      }
      else {
        pcVar6 = "adj n0";
        uVar5 = 0x80;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar5,
             "ref_edge_uniq",(ulong)uVar3,pcVar6);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x67,
           "ref_edge_uniq",(ulong)uVar3,"find existing");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_edge_uniq(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1) {
  REF_INT edge;

  /* do nothing if we already have it */
  RXS(ref_edge_with(ref_edge, node0, node1, &edge), REF_NOT_FOUND,
      "find existing");
  if (REF_EMPTY != edge) return REF_SUCCESS;

  /* incremental reallocation */
  if (ref_edge_n(ref_edge) >= ref_edge_max(ref_edge)) {
    REF_INT orig, chunk;
    orig = ref_edge_max(ref_edge);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_edge_max(ref_edge) = orig + chunk;

    ref_realloc(ref_edge->e2n, 2 * ref_edge_max(ref_edge), REF_INT);
    for (edge = orig; edge < ref_edge_max(ref_edge); edge++) {
      ref_edge_e2n(ref_edge, 0, edge) = REF_EMPTY;
      ref_edge_e2n(ref_edge, 1, edge) = REF_EMPTY;
    }
  }

  edge = ref_edge_n(ref_edge);
  ref_edge_n(ref_edge)++;
  ref_edge_e2n(ref_edge, 0, edge) = node0;
  ref_edge_e2n(ref_edge, 1, edge) = node1;

  RSS(ref_adj_add(ref_edge_adj(ref_edge), ref_edge_e2n(ref_edge, 0, edge),
                  edge),
      "adj n0");
  RSS(ref_adj_add(ref_edge_adj(ref_edge), ref_edge_e2n(ref_edge, 1, edge),
                  edge),
      "adj n1");

  return REF_SUCCESS;
}